

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-error-after-write.c
# Opt level: O0

int run_test_tcp_connect_error_after_write(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  char *local_258;
  char *local_250;
  undefined1 auStack_240 [4];
  int r;
  uv_buf_t buf;
  uv_tcp_t conn;
  uv_write_t write_req;
  sockaddr_in addr;
  uv_connect_t connect_req;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)&write_req.bufsml[3].len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x47,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  uVar3 = uv_buf_init("TEST",4);
  local_258 = uVar3.base;
  _auStack_240 = local_258;
  local_250 = (char *)uVar3.len;
  buf.base = local_250;
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,(uv_tcp_t *)&buf.len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x4b,"r == 0");
    abort();
  }
  iVar1 = uv_write((uv_write_t *)&conn.queued_fds,(uv_stream_t *)&buf.len,(uv_buf_t *)auStack_240,1,
                   write_cb);
  if (iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x4e,"r == UV_EBADF");
    abort();
  }
  iVar1 = uv_tcp_connect((uv_connect_t *)addr.sin_zero,(uv_tcp_t *)&buf.len,
                         (sockaddr *)&write_req.bufsml[3].len,connect_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x54,"r == 0");
    abort();
  }
  iVar1 = uv_write((uv_write_t *)&conn.queued_fds,(uv_stream_t *)&buf.len,(uv_buf_t *)auStack_240,1,
                   write_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x57,"r == 0");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x5a,"r == 0");
    abort();
  }
  if (connect_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x5c,"connect_cb_called == 1");
    abort();
  }
  if (write_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x5d,"write_cb_called == 1");
    abort();
  }
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x5e,"close_cb_called == 1");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x60,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(tcp_connect_error_after_write) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_write_t write_req;
  uv_tcp_t conn;
  uv_buf_t buf;
  int r;

#ifdef _WIN32
  fprintf(stderr, "This test is disabled on Windows for now.\n");
  fprintf(stderr, "See https://github.com/joyent/libuv/issues/444\n");
  return 0; /* windows slackers... */
#endif

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  buf = uv_buf_init("TEST", 4);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT(r == 0);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT(r == UV_EBADF);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(connect_cb_called == 1);
  ASSERT(write_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}